

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.c
# Opt level: O0

KindMeta get_kind_meta(Kind kind)

{
  CharBuff *buff_00;
  Kind *pKVar1;
  char *pcVar2;
  KindMeta KVar3;
  int local_34;
  int i;
  KindMeta *meta;
  CharBuff *buff;
  undefined8 uStack_18;
  Kind kind_local;
  char *local_10;
  
  buff_00 = new_buff(2);
  if ((kind == NEWLINE) || (0x7f < kind)) {
    for (local_34 = 0; local_34 < 0x35; local_34 = local_34 + 1) {
      if (kind_table[local_34].kind == kind) {
        uStack_18 = *(undefined8 *)(kind_table + local_34);
        local_10 = kind_table[local_34].name;
        goto LAB_001034f4;
      }
    }
    uStack_18 = 0xd1;
    local_10 = (char *)0x0;
  }
  else {
    pKVar1 = (Kind *)malloc(0x10);
    append_chr(buff_00,(char)kind);
    *pKVar1 = kind;
    pcVar2 = to_string(buff_00);
    *(char **)(pKVar1 + 2) = pcVar2;
    recycle_buff(buff_00);
    uStack_18 = *(undefined8 *)pKVar1;
    local_10 = *(char **)(pKVar1 + 2);
  }
LAB_001034f4:
  KVar3._0_8_ = uStack_18 & 0xffffffff;
  KVar3.name = local_10;
  return KVar3;
}

Assistant:

KindMeta get_kind_meta(Kind kind) {
    CharBuff *buff = new_buff(2);
    if (kind != NEWLINE && kind >= 0 && kind <= 127) {
        KindMeta *meta = malloc(sizeof(KindMeta));
        append_chr(buff, (char) kind);
        meta->kind = kind;
        meta->name = to_string(buff);
        recycle_buff(buff);
        return *meta;
    } else {
        for (int i = 0; i < kind_count; ++i) {
            if (kind_table[i].kind == kind) {
                return kind_table[i];
            }
        }
    }
    return EMPTY_KIND;
}